

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

MutableStringView __thiscall
Corrade::Containers::String::findAnyOr(String *this,StringView characters,char *fail)

{
  BasicStringView<char> BVar1;
  MutableStringView MVar2;
  BasicStringView<char> local_30;
  
  BasicStringView<char>::BasicStringView(&local_30,this);
  BVar1 = BasicStringView<char>::findAnyOr(&local_30,characters,fail);
  MVar2._data = BVar1._data;
  MVar2._sizePlusFlags = BVar1._sizePlusFlags;
  return MVar2;
}

Assistant:

MutableStringView String::findAnyOr(const StringView characters, char* fail) {
    return MutableStringView{*this}.findAnyOr(characters, fail);
}